

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void MarkReachableBlocks(VmBlock *block)

{
  uint uVar1;
  VmBlock **ppVVar2;
  uint local_14;
  uint i;
  VmBlock *block_local;
  
  if ((block->visited & 1U) == 0) {
    block->visited = true;
    for (local_14 = 0; uVar1 = SmallArray<VmBlock_*,_4U>::size(&block->successors), local_14 < uVar1
        ; local_14 = local_14 + 1) {
      ppVVar2 = SmallArray<VmBlock_*,_4U>::operator[](&block->successors,local_14);
      MarkReachableBlocks(*ppVVar2);
    }
  }
  return;
}

Assistant:

void MarkReachableBlocks(VmBlock *block)
{
	if(block->visited)
		return;

	block->visited = true;

	for(unsigned i = 0; i < block->successors.size(); i++)
		MarkReachableBlocks(block->successors[i]);
}